

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::GetNode
          (TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>
           *this,FName *key)

{
  TValueTraits<FMenuDescriptor_*> local_31;
  FName local_30;
  TValueTraits<FMenuDescriptor_*> traits;
  Node *n;
  FName *key_local;
  TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_> *this_local;
  
  FName::FName((FName *)&stack0xffffffffffffffd4,key);
  this_local = (TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>
                *)FindKey(this,(FName *)&stack0xffffffffffffffd4);
  if (this_local ==
      (TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_> *)0x0) {
    FName::FName(&local_30,key);
    this_local = (TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>
                  *)NewKey(this,&local_30);
    TValueTraits<FMenuDescriptor_*>::Init(&local_31,(FMenuDescriptor **)&this_local->Size);
  }
  return (Node *)this_local;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}